

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefSite.h
# Opt level: O0

void __thiscall dg::dda::DefSiteSet::~DefSiteSet(DefSiteSet *this)

{
  std::
  set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  ::~set((set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
          *)0x16b6ae);
  return;
}

Assistant:

DefSiteSet intersect(const DefSiteSet &rhs) const {
        std::map<DefSite::NodeTy *, IntervalsList> lhssites;
        std::map<DefSite::NodeTy *, IntervalsList> rhssites;

        for (const auto &ds : *this) {
            lhssites[ds.target].add(ds.getInterval());
        }
        for (const auto &ds : rhs) {
            rhssites[ds.target].add(ds.getInterval());
        }

        DefSiteSet retval;

        for (auto &lit : lhssites) {
            auto rit = rhssites.find(lit.first);
            if (rit != rhssites.end()) {
                for (const auto &I : lit.second.intersectWith(rit->second)) {
                    retval.emplace(lit.first, I.start, I.length());
                }
            }
        }

        return retval;
    }